

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::FirstFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_2d9;
  LogicalType local_2d8;
  LogicalType local_2c0;
  LogicalType local_2a8;
  string local_290;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  ::std::__cxx11::string::string((string *)&local_290,"first",(allocator *)&local_140);
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_290);
  ::std::__cxx11::string::~string((string *)&local_290);
  LogicalType::LogicalType(&local_2c0,DECIMAL);
  __l._M_len = 1;
  __l._M_array = &local_2c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_270,__l,
             (allocator_type *)&local_2a8);
  LogicalType::LogicalType(&local_2d8,DECIMAL);
  AggregateFunction::AggregateFunction
            (&local_140,(vector<duckdb::LogicalType,_true> *)&local_270,&local_2d8,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindDecimalFirst<false,false>,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  LogicalType::~LogicalType(&local_2d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_270);
  LogicalType::~LogicalType(&local_2c0);
  LogicalType::LogicalType(&local_2d8,ANY);
  __l_00._M_len = 1;
  __l_00._M_array = &local_2d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2c0,__l_00,
             &local_2d9);
  LogicalType::LogicalType(&local_2a8,ANY);
  AggregateFunction::AggregateFunction
            (&local_270,(vector<duckdb::LogicalType,_true> *)&local_2c0,&local_2a8,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindFirst<false,false>,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  LogicalType::~LogicalType(&local_2a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2c0);
  LogicalType::~LogicalType(&local_2d8);
  return in_RDI;
}

Assistant:

AggregateFunctionSet FirstFun::GetFunctions() {
	AggregateFunctionSet first("first");
	AddFirstOperator<false, false>(first);
	return first;
}